

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O1

_Bool progress_meter(GlobalConfig *global,curltime *start,_Bool final)

{
  undefined1 auVar1 [12];
  byte bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  byte bVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  FILE *pFVar10;
  _Bool _Var11;
  time_t tVar12;
  timediff_t tVar13;
  per_transfer *ppVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  curl_off_t cVar19;
  int iVar20;
  curl_off_t cVar21;
  char *pcVar22;
  curl_off_t cVar23;
  long lVar24;
  curl_off_t cVar25;
  double dVar26;
  curltime cVar27;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  char ulpercen [4];
  char dlpercen [4];
  char time_total [10];
  char time_left [10];
  char buffer [3] [6];
  char time_spent [10];
  
  if ((global->field_0x64 & 3) == 0) {
    cVar27 = curlx_now();
    tVar12 = cVar27.tv_sec;
    iVar20 = cVar27.tv_usec;
    auVar1 = cVar27._0_12_;
    cVar27._12_4_ = 0;
    cVar27.tv_sec = auVar1._0_8_;
    cVar27.tv_usec = auVar1._8_4_;
    older.tv_usec = progress_meter_stamp_1;
    older.tv_sec = progress_meter_stamp_0;
    older._12_4_ = 0;
    tVar13 = curlx_timediff(cVar27,older);
    if (progress_meter_header == '\0') {
      progress_meter_header = '\x01';
      fputs("DL% UL%  Dled  Uled  Xfers  Live Total     Current  Left    Speed\n",
            (FILE *)tool_stderr);
    }
    if ((final) || (500 < tVar13)) {
      uVar8 = start->tv_sec;
      uVar9 = start->tv_usec;
      older_00.tv_usec = uVar9;
      older_00.tv_sec = uVar8;
      newer._12_4_ = 0;
      newer.tv_sec = auVar1._0_8_;
      newer.tv_usec = auVar1._8_4_;
      older_00._12_4_ = 0;
      tVar13 = curlx_timediff(newer,older_00);
      dlpercen[0] = '-';
      dlpercen[1] = '-';
      dlpercen[2] = '\0';
      dlpercen[3] = '\0';
      ulpercen[0] = '-';
      ulpercen[1] = '-';
      ulpercen[2] = '\0';
      ulpercen[3] = '\0';
      cVar23 = all_dlalready;
      cVar25 = all_ulalready;
      progress_meter_stamp_0 = tVar12;
      progress_meter_stamp_1 = iVar20;
      if (transfers == (per_transfer *)0x0) {
        bVar5 = 1;
        lVar24 = 0;
        bVar2 = 1;
      }
      else {
        bVar2 = 1;
        lVar24 = 0;
        bVar5 = 1;
        ppVar14 = transfers;
        cVar19 = all_ultotal;
        cVar21 = all_dltotal;
        do {
          if (ppVar14->dltotal == 0) {
            bVar5 = 0;
          }
          else if ((ppVar14->field_0x1c0 & 1) == 0) {
            cVar21 = cVar21 + ppVar14->dltotal;
            all_dltotal = cVar21;
            ppVar14->field_0x1c0 = ppVar14->field_0x1c0 | 1;
          }
          if (ppVar14->ultotal == 0) {
            bVar2 = 0;
          }
          else if ((ppVar14->field_0x1c0 & 2) == 0) {
            cVar19 = cVar19 + ppVar14->ultotal;
            all_ultotal = cVar19;
            ppVar14->field_0x1c0 = ppVar14->field_0x1c0 | 2;
          }
          cVar23 = cVar23 + ppVar14->dlnow;
          cVar25 = cVar25 + ppVar14->ulnow;
          lVar24 = lVar24 + (ulong)(((byte)ppVar14->field_0x1d8 >> 3 & 1) != 0);
          ppVar14 = ppVar14->next;
        } while (ppVar14 != (per_transfer *)0x0);
      }
      if ((bool)(all_dltotal != 0 & bVar5)) {
        if (cVar23 < 0x147ae147ae147ae) {
          lVar15 = (cVar23 * 100) / all_dltotal;
        }
        else {
          lVar15 = cVar23 / (all_dltotal / 100);
        }
        curl_msnprintf(dlpercen,4,"%3ld",lVar15);
      }
      if ((bool)(bVar2 & all_ultotal != 0)) {
        if (cVar25 < 0x147ae147ae147ae) {
          lVar15 = (cVar25 * 100) / all_ultotal;
        }
        else {
          lVar15 = cVar25 / (all_ultotal / 100);
        }
        curl_msnprintf(ulpercen,4,"%3ld",lVar15);
      }
      uVar16 = (ulong)speedindex;
      speedindex = speedindex + 1;
      speedstore[uVar16].dl = cVar23;
      speedstore[uVar16].ul = cVar25;
      speedstore[uVar16].stamp.tv_sec = tVar12;
      speedstore[uVar16].stamp.tv_usec = iVar20;
      if (9 < speedindex) {
        indexwrapped = '\x01';
        speedindex = 0;
      }
      if (indexwrapped == '\x01') {
        uVar6 = speedstore[speedindex].stamp.tv_sec;
        uVar7 = speedstore[speedindex].stamp.tv_usec;
        older_01.tv_usec = uVar7;
        older_01.tv_sec = uVar6;
        newer_00._12_4_ = 0;
        newer_00.tv_sec = auVar1._0_8_;
        newer_00.tv_usec = auVar1._8_4_;
        older_01._12_4_ = 0;
        lVar17 = curlx_timediff(newer_00,older_01);
        lVar15 = cVar25 - speedstore[speedindex].ul;
        lVar18 = cVar23 - speedstore[speedindex].dl;
      }
      else {
        uVar3 = start->tv_sec;
        uVar4 = start->tv_usec;
        older_02.tv_usec = uVar4;
        older_02.tv_sec = uVar3;
        newer_01._12_4_ = 0;
        newer_01.tv_sec = auVar1._0_8_;
        newer_01.tv_usec = auVar1._8_4_;
        older_02._12_4_ = 0;
        lVar17 = curlx_timediff(newer_01,older_02);
        lVar15 = cVar25;
        lVar18 = cVar23;
      }
      dVar26 = (double)(long)(lVar17 + (ulong)(lVar17 == 0)) / 1000.0;
      lVar18 = (long)((double)lVar18 / dVar26);
      lVar15 = (long)((double)lVar15 / dVar26);
      if (lVar15 < lVar18) {
        lVar15 = lVar18;
      }
      if ((bool)(bVar5 & lVar15 != 0)) {
        lVar18 = all_dltotal / lVar15;
        time2str(time_left,(all_dltotal - cVar23) / lVar15);
        time2str(time_total,lVar18);
      }
      else {
        builtin_strncpy(time_left,"--:--:--",9);
        builtin_strncpy(time_total,"--:--:--",9);
      }
      time2str(time_spent,tVar13 / 1000);
      pFVar10 = tool_stderr;
      max5data(cVar23,buffer[0]);
      max5data(cVar25,buffer[1]);
      cVar23 = all_xfers;
      max5data(lVar15,buffer[2]);
      pcVar22 = "";
      if (final) {
        pcVar22 = "\n";
      }
      curl_mfprintf(pFVar10,"\r%-3s %-3s %s %s %5ld %5ld  %s %s %s %s %5s",dlpercen,ulpercen,buffer,
                    buffer + 1,cVar23,lVar24,time_total,time_spent,time_left,buffer + 2,pcVar22);
      _Var11 = true;
    }
    else {
      _Var11 = false;
    }
    return _Var11;
  }
  return false;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct curltime *start,
                    bool final)
{
  static struct curltime stamp;
  static bool header = FALSE;
  struct curltime now;
  timediff_t diff;

  if(global->noprogress || global->silent)
    return FALSE;

  now = curlx_now();
  diff = curlx_timediff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live "
          "Total     Current  Left    Speed\n",
          tool_stderr);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = curlx_timediff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(per->added)
        all_running++;
    }
    if(dlknown && all_dltotal)
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow < (CURL_OFF_T_MAX/100) ?
                (all_dlnow * 100 / all_dltotal) :
                (all_dlnow / (all_dltotal/100)));

    if(ulknown && all_ultotal)
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow < (CURL_OFF_T_MAX/100) ?
                (all_ulnow * 100 / all_ultotal) :
                (all_ulnow / (all_ultotal/100)));

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      timediff_t deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = curlx_timediff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = curlx_timediff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      if(!deltams) /* no division by zero please */
        deltams++;
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(tool_stderr,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            " %s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}